

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_BALL(effect_handler_context_t *context)

{
  anon_enum_32 aVar1;
  _Bool _Var2;
  uint32_t uVar3;
  monster *mon_00;
  monster *pmVar4;
  source origin;
  wchar_t local_6c;
  trap *trap;
  wchar_t dir;
  monster *t_mon;
  wchar_t accuracy;
  wchar_t conf_level;
  monster *mon;
  loc_conflict lStack_20;
  wchar_t flg;
  loc_conflict target;
  wchar_t rad;
  wchar_t dam;
  effect_handler_context_t *context_local;
  
  target.y = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  if (context->radius == L'\0') {
    local_6c = L'\x02';
  }
  else {
    local_6c = context->radius;
  }
  target.x = local_6c;
  lStack_20 = (loc_conflict)loc(-1,-1);
  mon._4_4_ = L'|';
  aVar1 = (context->origin).what;
  if (aVar1 == SRC_TRAP) {
    mon._4_4_ = L'ࡼ';
    lStack_20 = ((context->origin).which.trap)->grid;
  }
  else if (aVar1 == SRC_PLAYER) {
    if ((context->dir == L'\x05') && (_Var2 = target_okay(), _Var2)) {
      mon._4_4_ = L'p';
      target_get((loc *)&lStack_20);
    }
    else {
      lStack_20 = (loc_conflict)loc_sum(player->grid,ddgrid[context->dir]);
    }
    if (context->other != L'\0') {
      target.x = (int)player->lev / context->other + target.x;
    }
  }
  else if (aVar1 == SRC_MONSTER) {
    mon_00 = (monster *)cave_monster(cave,(context->origin).which.monster);
    t_mon._0_4_ = 100;
    pmVar4 = monster_target_monster((effect_handler_context_t_conflict *)context);
    if (mon_00 == (monster *)0x0) {
      __assert_fail("mon",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-attack.c"
                    ,0x261,"_Bool effect_handler_BALL(effect_handler_context_t *)");
    }
    for (t_mon._4_4_ = monster_effect_level(mon_00,L'\x02'); t_mon._4_4_ != L'\0';
        t_mon._4_4_ = t_mon._4_4_ + L'\xffffffff') {
      t_mon._0_4_ = ((int)t_mon * 0x3c) / 100;
    }
    _Var2 = monster_is_powerful(mon_00);
    if (_Var2) {
      target.x = target.x + L'\x01';
    }
    mon._4_4_ = L'ࡰ';
    uVar3 = Rand_div(100);
    if ((int)t_mon < (int)(uVar3 + 1)) {
      uVar3 = Rand_div(9);
      lStack_20 = (loc_conflict)loc_sum((loc)mon_00->grid,ddgrid[(int)(uVar3 + 1)]);
    }
    else if (pmVar4 == (monster *)0x0) {
      _Var2 = monster_is_decoyed(mon_00);
      if (_Var2) {
        lStack_20 = (loc_conflict)cave_find_decoy(cave);
      }
      else {
        lStack_20.x = (player->grid).x;
        lStack_20.y = (player->grid).y;
      }
    }
    else {
      lStack_20 = pmVar4->grid;
    }
  }
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  _Var2 = project(origin,target.x,lStack_20,target.y,context->subtype,mon._4_4_,L'\0','\0',
                  context->obj);
  if (_Var2) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_BALL(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int rad = context->radius ? context->radius : 2;
	struct loc target = loc(-1, -1);

	int flg = PROJECT_THRU | PROJECT_STOP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Player or monster? */
	switch (context->origin.what) {
		case SRC_MONSTER: {
			struct monster *mon = cave_monster(cave, context->origin.which.monster);
			int conf_level, accuracy = 100;
			struct monster *t_mon = monster_target_monster(context);

			assert(mon);

			conf_level = monster_effect_level(mon, MON_TMD_CONF);
			while (conf_level) {
				accuracy *= (100 - CONF_RANDOM_CHANCE);
				accuracy /= 100;
				conf_level--;
			}

			/* Powerful monster */
			if (monster_is_powerful(mon)) {
				rad++;
			}

			flg |= PROJECT_PLAY;
			flg &= ~(PROJECT_STOP | PROJECT_THRU);

			if (randint1(100) > accuracy) {
				/* Confused direction */
				int dir = randint1(9);
				target = loc_sum(mon->grid, ddgrid[dir]);
			} else if (t_mon) {
				/* Target monster */
				target = t_mon->grid;
			} else {
				/* Target player */
				if (monster_is_decoyed(mon)) {
					target = cave_find_decoy(cave);
				} else {
					target = player->grid;
				}
			}

			break;
		}

		case SRC_TRAP: {
			struct trap *trap = context->origin.which.trap;
			flg |= PROJECT_PLAY;
			target = trap->grid;
			break;
		}

		case SRC_PLAYER:
			/* Ask for a target if no direction given */
			if (context->dir == DIR_TARGET && target_okay()) {
				flg &= ~(PROJECT_STOP | PROJECT_THRU);
				target_get(&target);
			} else {
				target = loc_sum(player->grid, ddgrid[context->dir]);
			}

			if (context->other) rad += player->lev / context->other;
			break;

		default:
			break;
	}

	/* Aim at the target, explode */
	if (project(context->origin, rad, target, dam, context->subtype, flg, 0, 0, context->obj))
		context->ident = true;

	return true;
}